

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

char * Io_MvLoadFileBz2(char *pFileName,int *pnFileSize)

{
  int iVar1;
  FILE *pFVar2;
  BZFILE *b;
  void *buf;
  char *pcVar3;
  long lVar4;
  void *__src;
  void *pvVar5;
  int *piVar6;
  FILE *pFVar7;
  int iVar8;
  void *pvVar9;
  int iVar10;
  int bzError;
  int local_44;
  FILE *local_40;
  int *local_38;
  
  pFVar2 = fopen(pFileName,"rb");
  iVar8 = (int)pFileName;
  if (pFVar2 == (FILE *)0x0) {
    pcVar3 = "Io_MvLoadFileBz2(): The file is unavailable (absent or open).\n";
LAB_002d14ce:
    Abc_Print(iVar8,pcVar3);
    return (char *)0x0;
  }
  iVar10 = 0;
  piVar6 = &local_44;
  b = BZ2_bzReadOpen(piVar6,(FILE *)pFVar2,0,0,(void *)0x0,0);
  if (local_44 != 0) {
    Abc_Print((int)piVar6,"Io_MvLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n");
    return (char *)0x0;
  }
  pvVar5 = (void *)0x0;
  pvVar9 = (void *)0x0;
  local_40 = pFVar2;
  local_38 = pnFileSize;
  do {
    buf = malloc(0x100010);
    __src = buf;
    if (pvVar9 != (void *)0x0) {
      *(void **)((long)pvVar5 + 0x100008) = buf;
      __src = pvVar9;
    }
    piVar6 = &local_44;
    iVar1 = BZ2_bzRead(piVar6,b,buf,0x100000);
    iVar8 = (int)piVar6;
    *(int *)((long)buf + 0x100000) = iVar1;
    iVar10 = iVar10 + iVar1;
    *(undefined8 *)((long)buf + 0x100008) = 0;
    pvVar5 = buf;
    pvVar9 = __src;
  } while (local_44 == 0);
  if (local_44 == -5) {
    BZ2_bzReadClose(&local_44,b);
    pFVar2 = local_40;
    fseek(local_40,0,2);
    pFVar7 = pFVar2;
    lVar4 = ftell(pFVar2);
    iVar8 = (int)pFVar7;
    iVar10 = (int)lVar4;
    if (iVar10 == 0) {
      pcVar3 = "Io_MvLoadFileBz2(): The file is empty.\n";
      goto LAB_002d14ce;
    }
    pcVar3 = (char *)malloc((long)(iVar10 + 10));
    rewind(pFVar2);
    fread(pcVar3,(long)iVar10,1,pFVar2);
  }
  else {
    if (local_44 != 4) {
      pcVar3 = "Io_MvLoadFileBz2(): Unable to read the compressed BLIF.\n";
      goto LAB_002d14ce;
    }
    BZ2_bzReadClose(&local_44,b);
    pcVar3 = (char *)malloc((long)(iVar10 + 10));
    iVar8 = 0;
    do {
      memcpy(pcVar3 + iVar8,__src,(long)*(int *)((long)__src + 0x100000));
      iVar8 = iVar8 + *(int *)((long)__src + 0x100000);
      pvVar5 = *(void **)((long)__src + 0x100008);
      if (__src != (void *)0x0) {
        free(__src);
      }
      pFVar2 = local_40;
      __src = pvVar5;
    } while (pvVar5 != (void *)0x0);
  }
  fclose(pFVar2);
  builtin_strncpy(pcVar3 + iVar10,"\n.en",4);
  builtin_strncpy(pcVar3 + (long)iVar10 + 3,"nd\n",4);
  *local_38 = iVar10;
  return pcVar3;
}

Assistant:

char * Io_MvLoadFileBz2( char * pFileName, int * pnFileSize )
{
    FILE    * pFile;
    int       nFileSize = 0;
    char    * pContents;
    BZFILE  * b;
    int       bzError, RetValue;
    struct buflist * pNext;
    buflist * bufHead = NULL, * buf = NULL;

    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Io_MvLoadFileBz2(): The file is unavailable (absent or open).\n" );
        return NULL;
    }
    b = BZ2_bzReadOpen(&bzError,pFile,0,0,NULL,0);
    if (bzError != BZ_OK) {
        Abc_Print( -1, "Io_MvLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n",bzError );
        return NULL;
    }
    do {
        if (!bufHead)
            buf = bufHead = ABC_ALLOC( buflist, 1 );
        else
            buf = buf->next = ABC_ALLOC( buflist, 1 );
        nFileSize += buf->nBuf = BZ2_bzRead(&bzError,b,buf->buf,1<<20);
        buf->next = NULL;
    } while (bzError == BZ_OK);
    if (bzError == BZ_STREAM_END) {
        // we're okay
        char * p;
        int nBytes = 0;
        BZ2_bzReadClose(&bzError,b);
        p = pContents = ABC_ALLOC( char, nFileSize + 10 );
        buf = bufHead;
        do {
            memcpy(p+nBytes,buf->buf,buf->nBuf);
            nBytes += buf->nBuf;
//        } while((buf = buf->next));
            pNext = buf->next;
            ABC_FREE( buf );
        } while((buf = pNext));
    } else if (bzError == BZ_DATA_ERROR_MAGIC) {
        // not a BZIP2 file
        BZ2_bzReadClose(&bzError,b);
        fseek( pFile, 0, SEEK_END );
        nFileSize = ftell( pFile );
        if ( nFileSize == 0 )
        {
            Abc_Print( -1, "Io_MvLoadFileBz2(): The file is empty.\n" );
            return NULL;
        }
        pContents = ABC_ALLOC( char, nFileSize + 10 );
        rewind( pFile );
        RetValue = fread( pContents, nFileSize, 1, pFile );
    } else { 
        // Some other error.
        Abc_Print( -1, "Io_MvLoadFileBz2(): Unable to read the compressed BLIF.\n" );
        return NULL;
    }
    fclose( pFile );
    // finish off the file with the spare .end line
    // some benchmarks suddenly break off without this line
    strcpy( pContents + nFileSize, "\n.end\n" );
    *pnFileSize = nFileSize;
    return pContents;
}